

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-util.c
# Opt level: O3

wchar_t borg_panel_hgt(void)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = Term->hgt;
  if (Term == angband_term[0]) {
    iVar1 = iVar1 - (row_top_map[Term->sidebar_mode] + row_bottom_map[Term->sidebar_mode]);
  }
  wVar2 = iVar1 / (int)(uint)tile_height;
  if (wVar2 < L'\x02') {
    wVar2 = L'\x01';
  }
  return wVar2;
}

Assistant:

int borg_panel_hgt(void)
{
    int panel_hgt;

    /* Use dimensions that match those in ui-output.c. */
    if (Term == term_screen) {
        panel_hgt = SCREEN_HGT;
    } else {
        panel_hgt = Term->hgt / tile_height;
    }
    /* Bound below to avoid division by zero. */
    return MAX(panel_hgt, 1);
}